

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O3

void S_ParseMusInfo(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  level_info_t *plVar4;
  Node *pNVar5;
  int lastlump;
  FScanner sc;
  int local_134;
  FScanner local_130;
  
  local_134 = 0;
  iVar2 = FWadCollection::FindLump(&Wads,"MUSINFO",&local_134,false);
  if (iVar2 != -1) {
    do {
      FScanner::FScanner(&local_130,iVar2);
      while( true ) {
        bVar1 = FScanner::GetString(&local_130);
        if (!bVar1) break;
        plVar4 = FindLevelInfo(local_130.String,true);
        if (plVar4 == (level_info_t *)0x0) {
          FScanner::ScriptMessage(&local_130,"Unknown map \'%s\'",local_130.String);
        }
        while( true ) {
          bVar1 = FScanner::CheckNumber(&local_130);
          iVar2 = local_130.Number;
          if (!bVar1) break;
          FScanner::MustGetString(&local_130);
          if (0 < iVar2) {
            iVar3 = FName::NameManager::FindName(&FName::NameData,local_130.String,false);
            if (plVar4 != (level_info_t *)0x0) {
              pNVar5 = TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::GetNode
                                 (&plVar4->MusicMap,iVar2);
              (pNVar5->Pair).Value.Index = iVar3;
            }
          }
        }
      }
      FScanner::~FScanner(&local_130);
      iVar2 = FWadCollection::FindLump(&Wads,"MUSINFO",&local_134,false);
    } while (iVar2 != -1);
  }
  return;
}

Assistant:

void S_ParseMusInfo()
{
	int lastlump = 0, lump;

	while ((lump = Wads.FindLump ("MUSINFO", &lastlump)) != -1)
	{
		FScanner sc(lump);

		while (sc.GetString())
		{
			level_info_t *map = FindLevelInfo(sc.String);

			if (map == NULL)
			{
				// Don't abort for invalid maps
				sc.ScriptMessage("Unknown map '%s'", sc.String);
			}
			while (sc.CheckNumber())
			{
				int index = sc.Number;
				sc.MustGetString();
				if (index > 0)
				{
					FName music = sc.String;
					if (map != NULL)
					{
						map->MusicMap[index] = music;
					}
				}
			}
		}
	}
}